

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACEncode.cpp
# Opt level: O1

int __thiscall Inflate::readCB(Inflate *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  sVar3 = BitInStream::read(this->bitin,in_ESI,in_RDX,in_RCX);
  uVar2 = (uint)sVar3;
  if (uVar2 == 0xffffffff) {
    iVar1 = this->nBits;
    uVar2 = (uint)(iVar1 == 0x10);
    this->nBits = iVar1 + -1;
    if (iVar1 == 0) {
      this->readingDone = true;
    }
  }
  return uVar2;
}

Assistant:

int Inflate::readCB() {
    int temp = bitin.read();
    if (temp == -1) {
        (nBits == 16 ? temp = 1 : temp = 0);
        nBits--;
        if (nBits == -1) {
            readingDone = true;
        }
    }
    return temp;
}